

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

void Bind(ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator)

{
  byte *pbVar1;
  Type *pTVar2;
  undefined1 *puVar3;
  OpCode OVar4;
  uint uVar5;
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *this;
  Symbol **symRef;
  code *pcVar6;
  uint32 uVar7;
  bool bVar8;
  uint uVar9;
  ParseNodeBin *pPVar10;
  ParseNodeStr *pPVar11;
  ParseNodeVar *pPVar12;
  ParseNodeJump *pPVar13;
  ParseNodeName *pPVar14;
  ParseNodeRegExp *pPVar15;
  ParseNodeProg *pnode_00;
  FuncInfo *this_00;
  ParseNodePtr pPVar16;
  ParseNodeBlock *pPVar17;
  ParseNodeCatch *pPVar18;
  ParseNodeFnc *pPVar19;
  ParseNodeWith *pPVar20;
  ParseNodePtr *ppPVar21;
  Type *ppFVar22;
  FunctionBody *pFVar23;
  ParseNodeStmt *pnodeStmt;
  Symbol *pSVar24;
  undefined4 *puVar25;
  ParseNode *pPVar26;
  Symbol *pSVar27;
  Type this_01;
  
  if (pnode == (ParseNode *)0x0) {
    return;
  }
  OVar4 = pnode->nop;
  if (OVar4 < knopMember) {
    if (knopVoid < OVar4) {
      switch(OVar4) {
      case knopCall:
        break;
      case knopDot:
        BindInstAndMember(pnode,byteCodeGenerator);
        return;
      case knopAsg:
        BindReference(pnode,byteCodeGenerator);
        CheckLocalVarDef(pnode,byteCodeGenerator);
        return;
      case knopInstOf:
      case knopIn:
      case knopEqv:
      case knopNEqv:
        return;
      case knopComma:
        pPVar10 = ParseNode::AsParseNodeBin(pnode);
        puVar3 = &pPVar10->pnode1->field_0x1;
        *puVar3 = *puVar3 | 4;
        return;
      default:
        if ((OVar4 != knopDelete) && (OVar4 != knopIndex)) {
          return;
        }
      }
switchD_00824dd9_caseD_2f:
      BindReference(pnode,byteCodeGenerator);
      return;
    }
    if (OVar4 != knopName) {
      if (OVar4 == knopRegExp) {
        ppFVar22 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                             (&byteCodeGenerator->funcInfoStack->
                               super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
        pFVar23 = FuncInfo::GetParsedFunctionBody(*ppFVar22);
        uVar9 = Js::FunctionBody::NewLiteralRegex(pFVar23);
        pPVar15 = ParseNode::AsParseNodeRegExp(pnode);
        pPVar15->regexPatternIndex = uVar9;
        return;
      }
      if (OVar4 != knopTypeof) {
        return;
      }
      goto switchD_00824dd9_caseD_2f;
    }
    pPVar14 = ParseNode::AsParseNodeName(pnode);
    pSVar24 = pPVar14->sym;
    if (pSVar24 != (Symbol *)0x0) goto LAB_00824f0c;
    if (((pPVar14->super_ParseNode).grfpn & 0x2000) != 0) {
      return;
    }
    pSVar24 = ByteCodeGenerator::FindSymbol(byteCodeGenerator,pPVar14->symRef,pPVar14->pid,false);
    if (pSVar24 != (Symbol *)0x0) {
      pPVar26 = pSVar24->decl;
      if (pPVar26 != (ParseNode *)0x0) {
        if ((pPVar14->symRef == (Symbol **)0x0) || (*pPVar14->symRef == (Symbol *)0x0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar25 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar25 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0x115f,
                             "(!sym->GetDecl() || (pnodeName->GetSymRef() && *pnodeName->GetSymRef()))"
                             ,
                             "!sym->GetDecl() || (pnodeName->GetSymRef() && *pnodeName->GetSymRef())"
                            );
          if (!bVar8) goto LAB_00825406;
          *puVar25 = 0;
          pPVar26 = pSVar24->decl;
          if (pPVar26 == (ParseNode *)0x0) goto LAB_00825391;
        }
        if (((*pPVar14->symRef)->decl != pPVar26) &&
           (pSVar27 = Symbol::GetFuncScopeVarSym(*pPVar14->symRef), pSVar27 != pSVar24)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar25 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar25 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0x1161,
                             "(!sym->GetDecl() || ((*pnodeName->GetSymRef())->GetDecl() == sym->GetDecl()) || ((*pnodeName->GetSymRef())->GetFuncScopeVarSym() == sym))"
                             ,
                             "!sym->GetDecl() || ((*pnodeName->GetSymRef())->GetDecl() == sym->GetDecl()) || ((*pnodeName->GetSymRef())->GetFuncScopeVarSym() == sym)"
                            );
          if (!bVar8) {
LAB_00825406:
            pcVar6 = (code *)invalidInstructionException();
            (*pcVar6)();
          }
          *puVar25 = 0;
        }
      }
LAB_00825391:
      pPVar14->sym = pSVar24;
      if (pSVar24->symbolType != STFunction) goto LAB_00824f0c;
      if (((pSVar24->field_0x42 & 8) == 0) || ((byteCodeGenerator->flags & 0x400) != 0)) {
        ByteCodeGenerator::FuncEscapes(byteCodeGenerator,pSVar24->scope);
      }
    }
    pSVar24 = pPVar14->sym;
    if (pSVar24 == (Symbol *)0x0) {
      return;
    }
LAB_00824f0c:
    pSVar24->field_0x43 = pSVar24->field_0x43 | 1;
    return;
  }
  switch(OVar4) {
  case knopList:
  case knopTemp:
  case knopClassDecl:
  case knopModule:
  case knopEndCode:
  case knopDebugger:
  case knopFor:
  case knopIf:
  case knopWhile:
  case knopDoWhile:
  case knopForIn:
  case knopForOf:
  case knopForAwaitOf:
  case knopStrTemplate:
  case knopWith:
  case knopSwitch:
  case knopCase:
    break;
  case knopVarDecl:
    pPVar12 = ParseNode::AsParseNodeVar(pnode);
    if (pPVar12->sym != (Symbol *)0x0) goto LAB_00825113;
    pPVar12 = ParseNode::AsParseNodeVar(pnode);
    symRef = pPVar12->symRef;
    pPVar12 = ParseNode::AsParseNodeVar(pnode);
    pSVar24 = ByteCodeGenerator::FindSymbol(byteCodeGenerator,symRef,pPVar12->pid,false);
    goto LAB_00825107;
  case knopConstDecl:
  case knopLetDecl:
    pPVar12 = ParseNode::AsParseNodeVar(pnode);
    if (pPVar12->sym != (Symbol *)0x0) goto LAB_00825113;
    pPVar12 = ParseNode::AsParseNodeVar(pnode);
    if ((pPVar12->symRef == (Symbol **)0x0) ||
       (pPVar12 = ParseNode::AsParseNodeVar(pnode), *pPVar12->symRef == (Symbol *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar25 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar25 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x11a3,
                         "(pnode->AsParseNodeVar()->symRef && *pnode->AsParseNodeVar()->symRef)",
                         "\'const\' and \'let\' should be binded when we bind block");
      if (!bVar8) goto LAB_00825406;
      *puVar25 = 0;
    }
    pPVar12 = ParseNode::AsParseNodeVar(pnode);
    pSVar24 = *pPVar12->symRef;
LAB_00825107:
    pPVar12 = ParseNode::AsParseNodeVar(pnode);
    pPVar12->sym = pSVar24;
LAB_00825113:
    SetAdditionalBindInfoForVariables(pnode,byteCodeGenerator);
    return;
  case knopFncDecl:
    pPVar19 = ParseNode::AsParseNodeFnc(pnode);
    if ((pPVar19->fncFlags & (kFunctionIsAsync|kFunctionIsGenerator)) != kFunctionNone) {
      ppFVar22 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                           (&byteCodeGenerator->funcInfoStack->
                             super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
      ByteCodeGenerator::FuncEscapes(byteCodeGenerator,(*ppFVar22)->bodyScope);
    }
    pPVar19 = ParseNode::AsParseNodeFnc(pnode);
    if ((pPVar19->fncFlags & kFunctionDeclaration) == kFunctionNone) {
      this = byteCodeGenerator->funcInfoStack;
      if ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
          (this->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
          super_SListNodeBase<Memory::ArenaAllocator>.next == this) {
        this_01 = (FuncInfo *)0x0;
      }
      else {
        ppFVar22 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                             (&this->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>)
        ;
        this_01 = *ppFVar22;
      }
      bVar8 = FuncInfo::IsGlobalFunction(this_01);
      if ((!bVar8) || ((byteCodeGenerator->flags & 0x400) != 0)) {
        ByteCodeGenerator::FuncEscapes(byteCodeGenerator,this_01->bodyScope);
      }
      ByteCodeGenerator::ProcessCapturedSyms(byteCodeGenerator,pnode);
      return;
    }
    if (byteCodeGenerator->loopDepth != 0) {
      pPVar19 = ParseNode::AsParseNodeFnc(pnode);
      pSVar24 = ParseNodeFnc::GetFuncSymbol(pPVar19);
      if ((pSVar24 != (Symbol *)0x0) &&
         (pSVar27 = Symbol::GetFuncScopeVarSym(pSVar24), pSVar27 != (Symbol *)0x0)) {
        if (pSVar27 == pSVar24) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar25 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar25 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0x1149,"(funcVarSym != funcSym)","funcVarSym != funcSym");
          if (!bVar8) goto LAB_00825406;
          *puVar25 = 0;
        }
        pSVar27->field_0x43 = pSVar27->field_0x43 | 1;
      }
    }
    break;
  case knopProg:
    pnode_00 = ParseNode::AsParseNodeProg(pnode);
    this_00 = ByteCodeGenerator::StartBindGlobalStatements(byteCodeGenerator,pnode_00);
    pPVar19 = ParseNode::AsParseNodeFnc(pnode);
    pPVar19->funcInfo = this_00;
    pPVar19 = ParseNode::AsParseNodeFnc(pnode);
    pPVar16 = ParseNodeFnc::GetParamScope(pPVar19);
    AddFunctionsToScope(pPVar16,byteCodeGenerator);
    pPVar19 = ParseNode::AsParseNodeFnc(pnode);
    AddVarsToScope(pPVar19->pnodeVars,byteCodeGenerator);
    uVar7 = byteCodeGenerator->flags;
    ppFVar22 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                         (&byteCodeGenerator->funcInfoStack->
                           super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
    (*ppFVar22)->inArgsCount = (ushort)uVar7 >> 0xb & 1;
    uVar5 = byteCodeGenerator->flags;
    bVar8 = FuncInfo::IsGlobalFunction(this_00);
    if ((bVar8) && ((uVar5 & 0x1000) == 0)) {
      if (this_00->byteCodeFunction != (ParseableFunctionInfo *)0x0) {
        puVar3 = &(this_00->byteCodeFunction->super_FunctionProxy).field_0x44;
        *puVar3 = *puVar3 & 0xfd;
      }
    }
    else {
      ByteCodeGenerator::SetRootFuncInfo(byteCodeGenerator,this_00);
    }
    pPVar19 = ParseNode::AsParseNodeFnc(pnode);
    if ((pPVar19->fncFlags & kFunctionCallsEval) != kFunctionNone) {
      this_00->field_0xb4 = this_00->field_0xb4 | 2;
    }
    break;
  case knopBlock:
    pPVar17 = ParseNode::AsParseNodeBlock(pnode);
    pPVar16 = pPVar17->pnodeScopes;
LAB_00825053:
    if (pPVar16 == (ParseNode *)0x0) {
      return;
    }
    OVar4 = pPVar16->nop;
    if (OVar4 < knopWith) {
      if (OVar4 != knopFncDecl) {
        if (OVar4 == knopBlock) {
          pPVar17 = ParseNode::AsParseNodeBlock(pPVar16);
          ppPVar21 = &pPVar17->pnodeNext;
          goto LAB_008250cb;
        }
        goto LAB_00825053;
      }
      pPVar19 = ParseNode::AsParseNodeFnc(pPVar16);
      if ((pPVar19->fncFlags & kFunctionDeclaration) != kFunctionNone) {
        ByteCodeGenerator::ProcessCapturedSyms(byteCodeGenerator,pPVar16);
      }
      pPVar19 = ParseNode::AsParseNodeFnc(pPVar16);
      ppPVar21 = &pPVar19->pnodeNext;
    }
    else {
      if (OVar4 == knopWith) {
        pPVar20 = ParseNode::AsParseNodeWith(pPVar16);
        ppPVar21 = &pPVar20->pnodeNext;
        goto LAB_008250cb;
      }
      if (OVar4 != knopCatch) goto LAB_00825053;
      pPVar18 = ParseNode::AsParseNodeCatch(pPVar16);
      ppPVar21 = &pPVar18->pnodeNext;
    }
LAB_008250cb:
    pPVar16 = *ppPVar21;
    goto LAB_00825053;
  case knopBreak:
  case knopContinue:
    pPVar13 = ParseNode::AsParseNodeJump(pnode);
    pnodeStmt = pPVar13->pnodeTarget;
    goto LAB_00825178;
  case knopTryCatch:
switchD_00824d84_caseD_69:
    ppFVar22 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                         (&byteCodeGenerator->funcInfoStack->
                           super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
    pFVar23 = FuncInfo::GetParsedFunctionBody(*ppFVar22);
    pTVar2 = &(pFVar23->super_ParseableFunctionInfo).flags;
    *pTVar2 = *pTVar2 | Flags_HasTry;
    ppFVar22 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                         (&byteCodeGenerator->funcInfoStack->
                           super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
    puVar3 = &((*ppFVar22)->byteCodeFunction->super_FunctionProxy).field_0x47;
    *puVar3 = *puVar3 | 8;
    pnodeStmt = ParseNode::AsParseNodeStmt(pnode);
LAB_00825178:
    ByteCodeGenerator::AddTargetStmt(byteCodeGenerator,pnodeStmt);
    return;
  default:
    if (OVar4 == knopTryFinally) {
      ppFVar22 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                           (&byteCodeGenerator->funcInfoStack->
                             super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
      pFVar23 = FuncInfo::GetParsedFunctionBody(*ppFVar22);
      pFVar23->m_hasFinally = true;
      goto switchD_00824d84_caseD_69;
    }
    if (OVar4 != knopObjectPatternMember) {
      return;
    }
  case knopMember:
  case knopMemberShort:
  case knopSetMember:
  case knopGetMember:
    pPVar10 = ParseNode::AsParseNodeBin(pnode);
    pPVar26 = pPVar10->pnode1;
    if (pPVar26->nop == knopStr) {
      pPVar11 = ParseNode::AsParseNodeStr(pPVar26);
      ByteCodeGenerator::AssignPropertyId(byteCodeGenerator,pPVar11->pid);
      pbVar1 = (byte *)((long)&pPVar26->grfpn + 1);
      *pbVar1 = *pbVar1 | 0x20;
    }
  }
  return;
}

Assistant:

void Bind(ParseNode *pnode, ByteCodeGenerator *byteCodeGenerator)
{
    if (pnode == nullptr)
{
        return;
    }

    switch (pnode->nop)
    {
    case knopBreak:
    case knopContinue:
        byteCodeGenerator->AddTargetStmt(pnode->AsParseNodeJump()->pnodeTarget);
        break;
    case knopProg:
        {
            FuncInfo* globFuncInfo = byteCodeGenerator->StartBindGlobalStatements(pnode->AsParseNodeProg());
            pnode->AsParseNodeFnc()->funcInfo = globFuncInfo;
            AddFunctionsToScope(pnode->AsParseNodeFnc()->GetTopLevelScope(), byteCodeGenerator);
            AddVarsToScope(pnode->AsParseNodeFnc()->pnodeVars, byteCodeGenerator);
            // There are no args to add, but "eval" gets a this pointer.
            byteCodeGenerator->SetNumberOfInArgs(!!(byteCodeGenerator->GetFlags() & fscrEvalCode));
            if (!globFuncInfo->IsFakeGlobalFunction(byteCodeGenerator->GetFlags()))
            {
                // Global code: the root function is the global function.
                byteCodeGenerator->SetRootFuncInfo(globFuncInfo);
            }
            else if (globFuncInfo->byteCodeFunction)
            {
            // If the current global code wasn't marked to be treated as global code (e.g. from deferred parsing),
            // we don't need to send a register script event for it.
                globFuncInfo->byteCodeFunction->SetIsTopLevel(false);
            }
            if (pnode->AsParseNodeFnc()->CallsEval())
            {
                globFuncInfo->SetCallsEval(true);
            }
            break;
        }
    case knopFncDecl:
        if (pnode->AsParseNodeFnc()->IsCoroutine())
        {
            // Always assume generator functions escape since tracking them requires tracking
            // the resulting generators in addition to the function.
            byteCodeGenerator->FuncEscapes(byteCodeGenerator->TopFuncInfo()->GetBodyScope());
        }
        if (!pnode->AsParseNodeFnc()->IsDeclaration())
        {
            FuncInfo *funcInfo = byteCodeGenerator->TopFuncInfo();
            if (!funcInfo->IsGlobalFunction() || (byteCodeGenerator->GetFlags() & fscrEval))
            {
                // In the case of a nested function expression, assumes that it escapes.
                // We could try to analyze what it touches to be more precise.
                byteCodeGenerator->FuncEscapes(funcInfo->GetBodyScope());
            }
            byteCodeGenerator->ProcessCapturedSyms(pnode);
        }
        else if (byteCodeGenerator->IsInLoop())
        {
            Symbol *funcSym = pnode->AsParseNodeFnc()->GetFuncSymbol();
            if (funcSym)
            {
                Symbol *funcVarSym = funcSym->GetFuncScopeVarSym();
                if (funcVarSym)
                {
                    // We're going to write to the funcVarSym when we do the function instantiation,
                    // so treat the funcVarSym as used. That way, we know it will get undef-initialized at the
                    // top of the function, so a jitted loop body won't have any issue with boxing if
                    // the function instantiation isn't executed.
                    Assert(funcVarSym != funcSym);
                    funcVarSym->SetIsUsed(true);
                }
            }
        }
        break;
    case knopName:
    {
        ParseNodeName * pnodeName = pnode->AsParseNodeName();
        if (pnodeName->sym == nullptr)
        {
            if (pnodeName->grfpn & fpnMemberReference)
            {
                // This is a member name. No binding.
                break;
            }

            Symbol *sym = byteCodeGenerator->FindSymbol(pnodeName->GetSymRef(), pnodeName->pid);
            if (sym)
            {
                // This is a named load, not just a reference, so if it's a nested function note that all
                // the nested scopes escape.
                Assert(!sym->GetDecl() || (pnodeName->GetSymRef() && *pnodeName->GetSymRef()));
                Assert(!sym->GetDecl() || ((*pnodeName->GetSymRef())->GetDecl() == sym->GetDecl()) ||
                       ((*pnodeName->GetSymRef())->GetFuncScopeVarSym() == sym));

                pnodeName->sym = sym;
                if (sym->GetSymbolType() == STFunction &&
                    (!sym->GetIsGlobal() || (byteCodeGenerator->GetFlags() & fscrEval)))
                {
                    byteCodeGenerator->FuncEscapes(sym->GetScope());
                }
            }
        }

        if (pnodeName->sym)
        {
            pnodeName->sym->SetIsUsed(true);
        }

        break;
    }
    case knopMember:
    case knopMemberShort:
    case knopObjectPatternMember:
    case knopGetMember:
    case knopSetMember:

        {
            // lhs is knopStr, rhs is expr
            ParseNode *id = pnode->AsParseNodeBin()->pnode1;
            if (id->nop == knopStr)
            {
                byteCodeGenerator->AssignPropertyId(id->AsParseNodeStr()->pid);
                id->grfpn |= fpnMemberReference;
            }
            break;
        }

        // TODO: convert index over string to Get/Put Value
    case knopIndex:
        BindReference(pnode, byteCodeGenerator);
        break;
    case knopDot:
        BindInstAndMember(pnode, byteCodeGenerator);
        break;
    case knopTryFinally:
        byteCodeGenerator->SetHasFinally(true);
    case knopTryCatch:
        byteCodeGenerator->SetHasTry(true);
        byteCodeGenerator->TopFuncInfo()->byteCodeFunction->SetDontInline(true);
        byteCodeGenerator->AddTargetStmt(pnode->AsParseNodeStmt());
        break;
    case knopAsg:
        BindReference(pnode, byteCodeGenerator);
        CheckLocalVarDef(pnode, byteCodeGenerator);
        break;
    case knopVarDecl:
        // "arguments" symbol or decl w/o RHS may have been bound already; otherwise, do the binding here.
        if (pnode->AsParseNodeVar()->sym == nullptr)
        {
            pnode->AsParseNodeVar()->sym = byteCodeGenerator->FindSymbol(pnode->AsParseNodeVar()->symRef, pnode->AsParseNodeVar()->pid);
        }
        SetAdditionalBindInfoForVariables(pnode, byteCodeGenerator);
        break;
    case knopConstDecl:
    case knopLetDecl:
        // "arguments" symbol or decl w/o RHS may have been bound already; otherwise, do the binding here.
        if (!pnode->AsParseNodeVar()->sym)
        {
            AssertMsg(pnode->AsParseNodeVar()->symRef && *pnode->AsParseNodeVar()->symRef, "'const' and 'let' should be binded when we bind block");
            pnode->AsParseNodeVar()->sym = *pnode->AsParseNodeVar()->symRef;
        }
        SetAdditionalBindInfoForVariables(pnode, byteCodeGenerator);
        break;
    case knopCall:
    case knopTypeof:
    case knopDelete:
        BindReference(pnode, byteCodeGenerator);
        break;

    case knopRegExp:
        pnode->AsParseNodeRegExp()->regexPatternIndex = byteCodeGenerator->TopFuncInfo()->GetParsedFunctionBody()->NewLiteralRegex();
        break;

    case knopComma:
        pnode->AsParseNodeBin()->pnode1->SetNotEscapedUse();
        break;

    case knopBlock:
    {
        for (ParseNode *pnodeScope = pnode->AsParseNodeBlock()->pnodeScopes; pnodeScope; /* no increment */)
        {
            switch (pnodeScope->nop)
            {
            case knopFncDecl:
                if (pnodeScope->AsParseNodeFnc()->IsDeclaration())
                {
                    byteCodeGenerator->ProcessCapturedSyms(pnodeScope);
                }
                pnodeScope = pnodeScope->AsParseNodeFnc()->pnodeNext;
                break;

            case knopBlock:
                pnodeScope = pnodeScope->AsParseNodeBlock()->pnodeNext;
                break;

            case knopCatch:
                pnodeScope = pnodeScope->AsParseNodeCatch()->pnodeNext;
                break;

            case knopWith:
                pnodeScope = pnodeScope->AsParseNodeWith()->pnodeNext;
                break;
            }
        }
        break;
    }

    }
}